

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall
sf::priv::GlxContext::GlxContext
          (GlxContext *this,GlxContext *shared,ContextSettings *settings,uint width,uint height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Display *display;
  VideoMode VVar6;
  
  GlContext::GlContext(&this->super_GlContext);
  (this->super_GlContext)._vptr_GlContext = (_func_int **)&PTR__GlxContext_00164b68;
  this->m_display = (Display *)0x0;
  this->m_window = 0;
  this->m_context = (GLXContext)0x0;
  this->m_pbuffer = 0;
  this->m_ownsWindow = false;
  uVar3 = settings->stencilBits;
  uVar4 = settings->antialiasingLevel;
  uVar5 = settings->majorVersion;
  uVar1 = *(undefined8 *)((long)&settings->antialiasingLevel + 1);
  uVar2 = *(undefined8 *)((long)&settings->minorVersion + 1);
  (this->super_GlContext).m_settings.depthBits = settings->depthBits;
  (this->super_GlContext).m_settings.stencilBits = uVar3;
  (this->super_GlContext).m_settings.antialiasingLevel = uVar4;
  (this->super_GlContext).m_settings.majorVersion = uVar5;
  *(undefined8 *)((long)&(this->super_GlContext).m_settings.antialiasingLevel + 1) = uVar1;
  *(undefined8 *)((long)&(this->super_GlContext).m_settings.minorVersion + 1) = uVar2;
  display = OpenDisplay();
  this->m_display = display;
  ensureExtensionsInit(display,*(int *)(display + 0xe0));
  VVar6 = VideoMode::getDesktopMode();
  createSurface(this,shared,width,height,VVar6.bitsPerPixel);
  createContext(this,shared);
  return;
}

Assistant:

GlxContext::GlxContext(GlxContext* shared, const ContextSettings& settings, unsigned int width, unsigned int height) :
m_display   (NULL),
m_window    (0),
m_context   (NULL),
m_pbuffer   (0),
m_ownsWindow(false)
{
    // Save the creation settings
    m_settings = settings;

    // Open the connection with the X server
    m_display = OpenDisplay();

    // Make sure that extensions are initialized
    ensureExtensionsInit(m_display, DefaultScreen(m_display));

    // Create the rendering surface (window or pbuffer if supported)
    createSurface(shared, width, height, VideoMode::getDesktopMode().bitsPerPixel);

    // Create the context
    createContext(shared);
}